

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.c
# Opt level: O1

int oid_subidentifier_encode_into(uchar **p,uchar *bound,uint value)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar4 = 0;
  uVar5 = value;
  do {
    uVar6 = uVar4;
    uVar4 = uVar6 + 1;
    bVar1 = 0x7f < uVar5;
    uVar5 = uVar5 >> 7;
  } while (bVar1);
  iVar2 = -0xb;
  if (uVar6 < (ulong)((long)bound - (long)*p)) {
    (*p)[uVar6] = (byte)value & 0x7f;
    uVar3 = uVar4;
    if (uVar4 != 1) {
      do {
        value = value >> 7;
        (*p)[uVar3 - 2] = (byte)value | 0x80;
        uVar6 = uVar6 - 1;
        uVar3 = uVar3 - 1;
      } while (uVar6 != 0);
    }
    *p = *p + uVar4;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int oid_subidentifier_encode_into(unsigned char **p,
                                         unsigned char *bound,
                                         unsigned int value)
{
    size_t num_bytes = oid_subidentifier_num_bytes(value);

    if ((size_t) (bound - *p) < num_bytes) {
        return MBEDTLS_ERR_OID_BUF_TOO_SMALL;
    }
    (*p)[num_bytes - 1] = (unsigned char) (value & 0x7f);
    value >>= 7;

    for (size_t i = 2; i <= num_bytes; i++) {
        (*p)[num_bytes - i] = 0x80 | (unsigned char) (value & 0x7f);
        value >>= 7;
    }
    *p += num_bytes;

    return 0;
}